

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O3

string * __thiscall
duckdb::AdditionalProcessInfo_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,FileSystem *fs,pid_t pid)

{
  int iVar1;
  char *pcVar2;
  _Alloc_hider __nptr;
  __pid_t _Var3;
  string *extraout_RAX;
  pointer pFVar4;
  char *pcVar5;
  ssize_t sVar6;
  int *piVar7;
  long lVar8;
  passwd *ppVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  string *extraout_RAX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  int params_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  string process_name;
  string proc_exe_link;
  string process_owner;
  string cmdline;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_1208;
  string *local_1200;
  char *local_11f8;
  undefined1 local_11f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_11e0;
  long local_11d0 [2];
  undefined1 *local_11c0;
  char *local_11b8;
  undefined1 local_11b0 [16];
  string *local_11a0;
  string local_1198;
  string local_1178;
  string local_1158;
  undefined1 *local_1138 [2];
  undefined1 local_1128 [16];
  string local_1118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10f8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10e8;
  string local_10d8;
  undefined1 *local_10b8 [2];
  undefined1 local_10a8 [16];
  string local_1098;
  string local_1078;
  string local_1058;
  string local_1038 [128];
  
  _Var3 = getpid();
  params_00 = (int)fs;
  if (_Var3 == params_00) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,
               "Lock is already held in current process, likely another DuckDB instance","");
    return extraout_RAX;
  }
  local_1200 = (string *)local_11f0;
  local_11f8 = (char *)0x0;
  local_11f0[0] = 0;
  local_11c0 = local_11b0;
  local_11b8 = (char *)0x0;
  local_11b0[0] = 0;
  local_11a0 = __return_storage_ptr__;
  local_1058._M_dataplus._M_p = (pointer)&local_1058.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1058,"/proc/%d/cmdline","");
  Exception::ConstructMessage<int>(local_1038,&local_1058,params_00);
  (**(code **)(*(long *)this + 0x10))(local_11f0 + 0x10,this,local_1038,1,0x100,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038[0]._M_dataplus._M_p != &local_1038[0].field_2) {
    operator_delete(local_1038[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1058._M_dataplus._M_p != &local_1058.field_2) {
    operator_delete(local_1058._M_dataplus._M_p);
  }
  pFVar4 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                       *)(local_11f0 + 0x10));
  FileHandle::ReadLine_abi_cxx11_(local_1038,pFVar4);
  pcVar5 = __xpg_basename(local_1038[0]._M_dataplus._M_p);
  pcVar2 = local_11f8;
  strlen(pcVar5);
  ::std::__cxx11::string::_M_replace((ulong)&local_1200,0,pcVar2,(ulong)pcVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038[0]._M_dataplus._M_p != &local_1038[0].field_2) {
    operator_delete(local_1038[0]._M_dataplus._M_p);
  }
  if ((long *)local_11e0._M_allocated_capacity != (long *)0x0) {
    (**(code **)(*(long *)local_11e0._M_allocated_capacity + 8))();
  }
  switchD_00569a20::default(local_1038,0,0x1000);
  local_1078._M_dataplus._M_p = (pointer)&local_1078.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1078,"/proc/%d/exe","");
  Exception::ConstructMessage<int>((string *)(local_11f0 + 0x10),&local_1078,params_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1078._M_dataplus._M_p != &local_1078.field_2) {
    operator_delete(local_1078._M_dataplus._M_p);
  }
  sVar6 = readlink((char *)local_11e0._M_allocated_capacity,(char *)local_1038,0x1000);
  pcVar2 = local_11f8;
  if (0 < sVar6) {
    strlen((char *)local_1038);
    ::std::__cxx11::string::_M_replace((ulong)&local_1200,0,pcVar2,(ulong)local_1038);
  }
  if ((long *)local_11e0._M_allocated_capacity != local_11d0) {
    operator_delete((void *)local_11e0._M_allocated_capacity);
  }
  local_1098._M_dataplus._M_p = (pointer)&local_1098.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1098,"/proc/%d/loginuid","");
  Exception::ConstructMessage<int>(local_1038,&local_1098,params_00);
  params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
  params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x100;
  (**(code **)(*(long *)this + 0x10))(&local_1208,this,local_1038,1,0x100,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038[0]._M_dataplus._M_p != &local_1038[0].field_2) {
    operator_delete(local_1038[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1098._M_dataplus._M_p != &local_1098.field_2) {
    operator_delete(local_1098._M_dataplus._M_p);
  }
  pFVar4 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                       *)&local_1208);
  FileHandle::ReadLine_abi_cxx11_(local_1038,pFVar4);
  __nptr._M_p = local_1038[0]._M_dataplus._M_p;
  piVar7 = __errno_location();
  iVar1 = *piVar7;
  *piVar7 = 0;
  lVar8 = strtol(__nptr._M_p,(char **)(local_11f0 + 0x10),10);
  if ((pointer)local_11e0._M_allocated_capacity == __nptr._M_p) {
    ::std::__throw_invalid_argument("stoi");
  }
  else if (((int)(__uid_t)lVar8 == lVar8) && (*piVar7 != 0x22)) {
    if (*piVar7 == 0) {
      *piVar7 = iVar1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1038[0]._M_dataplus._M_p != &local_1038[0].field_2) {
      operator_delete(local_1038[0]._M_dataplus._M_p);
    }
    ppVar9 = getpwuid((__uid_t)lVar8);
    pcVar2 = local_11b8;
    if (ppVar9 != (passwd *)0x0) {
      params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppVar9->pw_name;
      params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 strlen((char *)params);
      ::std::__cxx11::string::_M_replace((ulong)&local_11c0,0,pcVar2,(ulong)params);
    }
    if (local_1208._M_head_impl != (FileHandle *)0x0) {
      (*(local_1208._M_head_impl)->_vptr_FileHandle[1])();
    }
    local_10b8[0] = local_10a8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_10b8,"Conflicting lock is held in %s%s","");
    pcVar2 = local_11f8;
    if (local_11f8 == (char *)0x0) {
      local_1178._M_dataplus._M_p = (pointer)&local_1178.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1178,"PID %d","");
      Exception::ConstructMessage<int>(&local_10d8,&local_1178,params_00);
    }
    else {
      local_10f8[0] = &local_10e8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_10f8,"%s (PID %d)","");
      local_1118._M_dataplus._M_p = (pointer)&local_1118.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1118,local_1200,local_11f8 + (long)local_1200);
      params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((ulong)fs & 0xffffffff);
      StringUtil::Format<std::__cxx11::string,int>
                (&local_10d8,(StringUtil *)local_10f8,&local_1118,params,(int)params_1);
    }
    pcVar5 = local_11b8;
    if (local_11b8 == (char *)0x0) {
      local_1198._M_dataplus._M_p = (pointer)&local_1198.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1198,anon_var_dwarf_63f17de + 9);
    }
    else {
      local_1138[0] = local_1128;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1138," by user %s","");
      local_1158._M_dataplus._M_p = (pointer)&local_1158.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1158,local_11c0,local_11b8 + (long)local_11c0);
      StringUtil::Format<std::__cxx11::string>
                (&local_1198,(StringUtil *)local_1138,&local_1158,params);
    }
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
              (local_11a0,(StringUtil *)local_10b8,&local_10d8,&local_1198,params_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1198._M_dataplus._M_p != &local_1198.field_2) {
      operator_delete(local_1198._M_dataplus._M_p);
    }
    if (pcVar5 != (char *)0x0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1158._M_dataplus._M_p != &local_1158.field_2) {
        operator_delete(local_1158._M_dataplus._M_p);
      }
      if (local_1138[0] != local_1128) {
        operator_delete(local_1138[0]);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_10d8._M_dataplus._M_p != &local_10d8.field_2) {
      operator_delete(local_10d8._M_dataplus._M_p);
    }
    if (pcVar2 == (char *)0x0) {
      paVar10 = &local_1178.field_2;
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1118._M_dataplus._M_p != &local_1118.field_2) {
        operator_delete(local_1118._M_dataplus._M_p);
      }
      paVar10 = &local_10e8;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)(paVar10->_M_local_buf + -0x10) != paVar10) {
      operator_delete(*(undefined1 **)(paVar10->_M_local_buf + -0x10));
    }
    if (local_10b8[0] != local_10a8) {
      operator_delete(local_10b8[0]);
    }
    if (local_11c0 != local_11b0) {
      operator_delete(local_11c0);
    }
    if (local_1200 == (string *)local_11f0) {
      return (string *)local_11f0;
    }
    operator_delete(local_1200);
    return extraout_RAX_00;
  }
  ::std::__throw_out_of_range("stoi");
}

Assistant:

static string AdditionalProcessInfo(FileSystem &fs, pid_t pid) {
	if (pid == getpid()) {
		return "Lock is already held in current process, likely another DuckDB instance";
	}
	string process_name, process_owner;

	try {
		auto cmdline_file = fs.OpenFile(StringUtil::Format("/proc/%d/cmdline", pid), FileFlags::FILE_FLAGS_READ);
		auto cmdline = cmdline_file->ReadLine();
		process_name = basename(const_cast<char *>(cmdline.c_str())); // NOLINT: old C API does not take const
	} catch (std::exception &) {
		// ignore
	}

	// we would like to provide a full path to the executable if possible but we might not have rights
	{
		char exe_target[PATH_MAX];
		memset(exe_target, '\0', PATH_MAX);
		auto proc_exe_link = StringUtil::Format("/proc/%d/exe", pid);
		auto readlink_n = readlink(proc_exe_link.c_str(), exe_target, PATH_MAX);
		if (readlink_n > 0) {
			process_name = exe_target;
		}
	}

	// try to find out who created that process
	try {
		auto loginuid_file = fs.OpenFile(StringUtil::Format("/proc/%d/loginuid", pid), FileFlags::FILE_FLAGS_READ);
		auto uid = std::stoi(loginuid_file->ReadLine());
		auto pw = getpwuid(uid);
		if (pw) {
			process_owner = pw->pw_name;
		}
	} catch (std::exception &) {
		// ignore
	}

	return StringUtil::Format("Conflicting lock is held in %s%s",
	                          !process_name.empty() ? StringUtil::Format("%s (PID %d)", process_name, pid)
	                                                : StringUtil::Format("PID %d", pid),
	                          !process_owner.empty() ? StringUtil::Format(" by user %s", process_owner) : "");
}